

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBToYJRow_AVX2(uint8_t *src_argb,uint8_t *dst_y,int width)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  lvec32 aiVar4;
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  aiVar4 = libyuv::kPermdARGBToY_AVX;
  auVar8._16_16_ = (undefined1  [16])libyuv::kARGBToYJ;
  auVar8._0_16_ = (undefined1  [16])libyuv::kARGBToYJ;
  auVar9._16_16_ = (undefined1  [16])libyuv::kSub128;
  auVar9._0_16_ = (undefined1  [16])libyuv::kSub128;
  do {
    auVar6 = vpsubb_avx2(*(undefined1 (*) [32])src_argb,auVar9);
    auVar7 = vpsubb_avx2(*(undefined1 (*) [32])((long)src_argb + 0x20),auVar9);
    auVar2 = vpsubb_avx2(*(undefined1 (*) [32])((long)src_argb + 0x40),auVar9);
    auVar3 = vpsubb_avx2(*(undefined1 (*) [32])((long)src_argb + 0x60),auVar9);
    auVar6 = vpmaddubsw_avx2(auVar8,auVar6);
    auVar7 = vpmaddubsw_avx2(auVar8,auVar7);
    auVar2 = vpmaddubsw_avx2(auVar8,auVar2);
    auVar3 = vpmaddubsw_avx2(auVar8,auVar3);
    src_argb = (uint8_t *)((long)src_argb + 0x80);
    auVar6 = vphaddw_avx2(auVar6,auVar7);
    auVar7 = vphaddw_avx2(auVar2,auVar3);
    auVar6 = vpaddw_avx2(auVar6,auVar9);
    auVar7 = vpaddw_avx2(auVar7,auVar9);
    auVar6 = vpsrlw_avx2(auVar6,8);
    auVar7 = vpsrlw_avx2(auVar7,8);
    auVar6 = vpackuswb_avx2(auVar6,auVar7);
    auVar6 = vpermd_avx2((undefined1  [32])aiVar4,auVar6);
    *(undefined1 (*) [32])dst_y = auVar6;
    dst_y = (uint8_t *)((long)dst_y + 0x20);
    iVar5 = width + -0x20;
    bVar1 = 0x1f < width;
    width = iVar5;
  } while (iVar5 != 0 && bVar1);
  return;
}

Assistant:

void ARGBToYJRow_AVX2(const uint8_t* src_argb, uint8_t* dst_y, int width) {
  asm volatile(
      "vbroadcastf128 %3,%%ymm4                  \n"
      "vbroadcastf128 %4,%%ymm5                  \n"
      "vmovdqu     %5,%%ymm6                     \n"

      LABELALIGN RGBTOY_AVX2(ymm5)
      : "+r"(src_argb),         // %0
        "+r"(dst_y),            // %1
        "+r"(width)             // %2
      : "m"(kARGBToYJ),         // %3
        "m"(kSub128),           // %4
        "m"(kPermdARGBToY_AVX)  // %5
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}